

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.h
# Opt level: O2

void __thiscall parameters::parameters(parameters *this)

{
  long lVar1;
  float *pfVar2;
  float (*pafVar3) [5];
  byte bVar4;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  allocator_type local_89;
  float local_88 [8];
  vector<float,_std::allocator<float>_> *local_68;
  vector<float,_std::allocator<float>_> *local_60;
  vector<float,_std::allocator<float>_> *local_58;
  vector<float,_std::allocator<float>_> *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  vector<float,_std::allocator<float>_> *local_40;
  vector<float,_std::allocator<float>_> *local_38;
  
  bVar4 = 0;
  this->tempo = 1.0;
  local_88[0] = 1.0;
  local_88[1] = 1.0;
  local_88[2] = 1.0;
  local_88[3] = 1.0;
  local_88[4] = 1.0;
  local_88[5] = 1.0;
  __l._M_len = 6;
  __l._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->sq_score_scaling,__l,&local_89);
  local_88[0] = 1.0;
  local_88[1] = 1.0;
  local_88[2] = 1.0;
  local_88[3] = 1.0;
  local_88[4] = 0.25;
  __l_00._M_len = 5;
  __l_00._M_array = local_88;
  local_38 = &this->sq_score_scaling;
  std::vector<float,_std::allocator<float>_>::vector(&this->mobility_scaling,__l_00,&local_89);
  local_88[0] = 7.0;
  local_88[1] = 4.0;
  local_88[2] = 3.5;
  local_88[3] = 1.5;
  local_88[4] = 1.0;
  __l_01._M_len = 5;
  __l_01._M_array = local_88;
  local_40 = &this->mobility_scaling;
  std::vector<float,_std::allocator<float>_>::vector(&this->square_attks,__l_01,&local_89);
  local_88[0] = 1.0;
  local_88[1] = 1.0;
  local_88[2] = 1.0;
  local_88[3] = 1.0;
  local_88[4] = 1.0;
  __l_02._M_len = 5;
  __l_02._M_array = local_88;
  local_48 = &this->square_attks;
  std::vector<float,_std::allocator<float>_>::vector(&this->attack_scaling,__l_02,&local_89);
  this->knight_attks[0] = 1.0;
  this->knight_attks[1] = 3.0;
  this->knight_attks[2] = 4.0;
  this->knight_attks[3] = 9.45;
  this->knight_attks[4] = 16.4;
  this->knight_attks[5] = 25.3;
  this->bishop_attks[0] = 1.0;
  this->bishop_attks[1] = 3.0;
  this->bishop_attks[2] = 3.5;
  this->bishop_attks[3] = 9.45;
  this->bishop_attks[4] = 16.4;
  this->bishop_attks[5] = 25.3;
  this->rook_attks[0] = 0.5;
  this->rook_attks[1] = 1.5;
  this->rook_attks[2] = 4.5;
  this->rook_attks[3] = 4.725;
  this->rook_attks[4] = 7.2;
  this->rook_attks[5] = 14.65;
  this->queen_attks[0] = 0.25;
  this->queen_attks[1] = 0.75;
  this->queen_attks[2] = 2.25;
  this->queen_attks[3] = 2.3625;
  this->queen_attks[4] = 3.6;
  this->queen_attks[5] = 8.825;
  local_88[0] = 1.0;
  local_88[1] = 2.0;
  __l_03._M_len = 2;
  __l_03._M_array = local_88;
  local_50 = &this->attack_scaling;
  std::vector<float,_std::allocator<float>_>::vector(&this->trapped_rook_penalty,__l_03,&local_89);
  local_60 = &this->attk_queen_bonus;
  local_88[0] = 2.0;
  local_88[1] = 1.0;
  local_88[2] = 1.0;
  local_88[3] = 1.0;
  local_88[4] = 0.0;
  __l_04._M_len = 5;
  __l_04._M_array = local_88;
  local_58 = &this->trapped_rook_penalty;
  std::vector<float,_std::allocator<float>_>::vector(local_60,__l_04,&local_89);
  local_68 = &this->pinned_scaling;
  local_88[0] = 1.0;
  local_88[1] = 1.0;
  local_88[2] = 2.0;
  local_88[3] = 3.0;
  local_88[4] = 4.0;
  __l_05._M_len = 5;
  __l_05._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(local_68,__l_05,&local_89);
  local_88[4] = 3.0;
  local_88[5] = 2.0;
  local_88[6] = 1.0;
  local_88[7] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 1.0;
  local_88[2] = 2.0;
  local_88[3] = 3.0;
  __l_06._M_len = 8;
  __l_06._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->knight_outpost_bonus,__l_06,&local_89);
  local_88[4] = 2.0;
  local_88[5] = 1.0;
  local_88[6] = 0.0;
  local_88[7] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 1.0;
  local_88[3] = 2.0;
  __l_07._M_len = 8;
  __l_07._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->bishop_outpost_bonus,__l_07,&local_89);
  local_88[0] = 0.0;
  local_88[1] = 1.0;
  local_88[2] = 1.0;
  local_88[3] = 1.0;
  local_88[4] = 1.0;
  local_88[5] = 0.0;
  __l_08._M_len = 6;
  __l_08._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->center_influence_bonus,__l_08,&local_89)
  ;
  this->pawn_king[0] = 1.0;
  this->pawn_king[1] = 2.0;
  *(undefined8 *)(this->pawn_king + 2) = 0x3f80000040400000;
  this->knight_king[1] = 2.0;
  this->knight_king[2] = 3.0;
  this->bishop_king[0] = 1.0;
  this->bishop_king[1] = 2.0;
  this->bishop_king[2] = 3.0;
  this->rook_king[0] = 1.0;
  this->rook_king[1] = 2.0;
  this->rook_king[2] = 3.0;
  this->rook_king[3] = 3.0;
  this->rook_king[4] = 4.0;
  this->queen_king[0] = 1.0;
  this->queen_king[1] = 3.0;
  this->queen_king[2] = 3.0;
  this->queen_king[3] = 4.0;
  this->queen_king[3] = 4.0;
  this->queen_king[4] = 4.0;
  this->queen_king[5] = 5.0;
  this->queen_king[6] = 6.0;
  pfVar2 = (float *)&DAT_0012a5b0;
  pafVar3 = this->attack_combos;
  for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
    (*pafVar3)[0] = *pfVar2;
    pfVar2 = pfVar2 + (ulong)bVar4 * -2 + 1;
    pafVar3 = (float (*) [5])((long)pafVar3 + (ulong)bVar4 * -8 + 4);
  }
  local_88[0] = 0.5;
  local_88[1] = 4.0;
  local_88[2] = 8.0;
  local_88[3] = 16.0;
  local_88[4] = 32.0;
  __l_09._M_len = 5;
  __l_09._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->attacker_weight,__l_09,&local_89);
  local_88[0] = -3.0;
  local_88[1] = -2.0;
  local_88[2] = 2.0;
  local_88[3] = 3.0;
  __l_10._M_len = 4;
  __l_10._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->king_shelter,__l_10,&local_89);
  local_88[4] = 0.0;
  local_88[5] = 1.0;
  local_88[6] = 2.0;
  local_88[7] = 4.0;
  local_88[0] = -4.0;
  local_88[1] = -2.0;
  local_88[2] = -1.0;
  local_88[3] = 0.0;
  __l_11._M_len = 8;
  __l_11._M_array = local_88;
  std::vector<float,_std::allocator<float>_>::vector(&this->king_safe_sqs,__l_11,&local_89);
  this->uncastled_penalty = 5.0;
  this->connected_rook_bonus = 1.0;
  this->doubled_bishop_bonus = 4.0;
  this->open_file_bonus = 1.0;
  this->bishop_open_center_bonus = 1.0;
  this->bishop_color_complex_penalty = 1.0;
  this->bishop_penalty_pawns_same_color = 1.0;
  this->rook_7th_bonus = 2.0;
  this->doubled_pawn_penalty = 4.0;
  this->backward_pawn_penalty = 1.0;
  this->isolated_pawn_penalty = 4.0;
  this->passed_pawn_bonus = 2.0;
  this->semi_open_pawn_penalty = 1.0;
  this->counter_move_bonus = 5.0;
  this->threat_evasion_bonus = 2.0;
  this->fixed_depth = -1;
  memcpy(this->pawn_lever_score,&DAT_0012a628,0x100);
  return;
}

Assistant:

parameters() {}